

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::anon_unknown_0::ParseMiscTest_InterpretedOptions_Test::
~ParseMiscTest_InterpretedOptions_Test(ParseMiscTest_InterpretedOptions_Test *this)

{
  ParserTest::~ParserTest(&this->super_ParseMiscTest);
  operator_delete(this,0xf0);
  return;
}

Assistant:

TEST_F(ParseMiscTest, InterpretedOptions) {
  // Since we're importing the generated code from parsing/compiling
  // unittest_custom_options.proto, we can just look at the option
  // values from that file's descriptor in the generated code.
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromInf ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isinf(float_val));
    ASSERT_GT(float_val, 0);
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isinf(double_val));
    ASSERT_GT(double_val, 0);
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNegativeInf ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isinf(float_val));
    ASSERT_LT(float_val, 0);
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isinf(double_val));
    ASSERT_LT(double_val, 0);
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNan ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isnan(float_val));
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isnan(double_val));
  }
  {
    const MessageOptions& options =
        proto2_unittest::SettingRealsFromNegativeNan ::descriptor()->options();
    float float_val = options.GetExtension(proto2_unittest::float_opt);
    ASSERT_TRUE(std::isnan(float_val));
    double double_val = options.GetExtension(proto2_unittest::double_opt);
    ASSERT_TRUE(std::isnan(double_val));
  }
}